

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hpp
# Opt level: O0

void Lib::
     OutputAll<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_unsigned_int,_const_char_*>
     ::apply(ostream *out,char *m,
            basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ms,char *ms_1,
            uint ms_2,char *ms_3)

{
  string *in_RDX;
  char *in_RSI;
  ostream *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *m_00;
  ostream *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [2];
  ostream *local_8;
  
  local_8 = in_RDI;
  std::operator<<(in_RDI,in_RSI);
  m_00 = local_50;
  std::__cxx11::string::string((string *)m_00,in_RDX);
  OutputAll<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_unsigned_int,_const_char_*>
  ::apply(in_stack_ffffffffffffffa0,m_00,(char *)local_8,(uint)((ulong)in_RDX >> 0x20),
          (char *)0x88ca5f);
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

static void apply(std::ostream& out, M m, Ms... ms) {
    out << m;
    OutputAll<Ms...>::apply(out, ms...);
  }